

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O1

int spki_table_remove_entry(spki_table *spki_table,spki_record *spki_record)

{
  hash_cmp_fp p_Var1;
  tommy_list ptVar2;
  tommy_list ptVar3;
  spki_update_fp p_Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  void *ptr;
  long lVar9;
  tommy_list *pptVar10;
  uint8_t *puVar11;
  undefined8 *puVar12;
  tommy_list ptVar13;
  tommy_hashlin_node *ptVar14;
  long in_FS_OFFSET;
  byte bVar15;
  key_entry entry;
  spki_record in_stack_fffffffffffffe78;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  uint32_t local_e4;
  undefined8 local_e0 [11];
  undefined2 local_88;
  uint8_t local_86;
  rtr_socket *local_80;
  long local_38;
  
  bVar15 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e4 = spki_record->asn;
  local_80 = spki_record->socket;
  local_e8 = *(undefined4 *)(spki_record->ski + 0x10);
  local_f8 = *(undefined8 *)spki_record->ski;
  uStack_f0 = *(undefined8 *)(spki_record->ski + 8);
  puVar11 = spki_record->spki;
  puVar12 = local_e0;
  for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar12 = *(undefined8 *)puVar11;
    puVar11 = puVar11 + 8;
    puVar12 = puVar12 + 1;
  }
  local_88 = *(undefined2 *)(spki_record->spki + 0x58);
  local_86 = spki_record->spki[0x5a];
  uVar6 = local_e4 * -0x3f >> 0x11 ^ local_e4 * -0x3f;
  uVar6 = uVar6 * -0x1ff ^ uVar6 * -0x1ff0;
  uVar6 = uVar6 * -7 ^ uVar6 * -0x1c00;
  uVar6 = uVar6 >> 0xf ^ uVar6;
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  uVar7 = (spki_table->hashtable).low_mask & uVar6;
  if (uVar7 < (spki_table->hashtable).split) {
    uVar7 = (spki_table->hashtable).bucket_mask & uVar6;
  }
  uVar5 = 0x1f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  ptVar14 = (spki_table->hashtable).bucket[uVar5][uVar7];
  iVar8 = -3;
  if (ptVar14 != (tommy_hashlin_node *)0x0) {
    p_Var1 = spki_table->cmp_fp;
    do {
      if (ptVar14->key == uVar6) {
        iVar8 = (*p_Var1)(&local_f8,ptVar14->data);
        if (iVar8 == 0) {
          iVar8 = -3;
          if (ptVar14->data != (void *)0x0) {
            ptr = tommy_hashlin_remove(&spki_table->hashtable,spki_table->cmp_fp,&local_f8,uVar6);
            iVar8 = -1;
            if (ptr != (void *)0x0) {
              ptVar2 = spki_table->list;
              ptVar3 = *(tommy_list *)((long)ptr + 0xa0);
              ptVar13 = ptVar3;
              if (ptVar3 == (tommy_list)0x0) {
                ptVar13 = ptVar2;
              }
              ptVar13->prev = *(tommy_node_struct **)((long)ptr + 0xa8);
              if (ptVar2 == (tommy_list)((long)ptr + 0xa0)) {
                pptVar10 = &spki_table->list;
              }
              else {
                pptVar10 = *(tommy_list **)((long)ptr + 0xa8);
              }
              *pptVar10 = ptVar3;
              if (*(long *)((long)ptr + 0xb0) != 0) {
                lrtr_free(ptr);
                p_Var4 = spki_table->update_fp;
                if (p_Var4 == (spki_update_fp)0x0) {
                  iVar8 = 0;
                }
                else {
                  puVar12 = (undefined8 *)&stack0xfffffffffffffe78;
                  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
                    *puVar12 = *(undefined8 *)spki_record->ski;
                    spki_record = (spki_record *)((long)spki_record + (ulong)bVar15 * -0x10 + 8);
                    puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
                  }
                  iVar8 = 0;
                  (*p_Var4)(spki_table,in_stack_fffffffffffffe78,false);
                }
              }
            }
          }
          goto LAB_0010c50c;
        }
      }
      ptVar14 = ptVar14->next;
    } while (ptVar14 != (tommy_node_struct *)0x0);
    iVar8 = -3;
  }
LAB_0010c50c:
  pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_remove_entry(struct spki_table *spki_table, struct spki_record *spki_record)
{
	uint32_t hash;
	struct key_entry entry;
	struct key_entry *rmv_elem;
	int rtval = SPKI_ERROR;

	spki_record_to_key_entry(spki_record, &entry);
	hash = tommy_inthash_u32(spki_record->asn);

	pthread_rwlock_wrlock(&spki_table->lock);

	if (!tommy_hashlin_search(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash)) {
		rtval = SPKI_RECORD_NOT_FOUND;
	} else {
		/* Remove from hashtable and list */
		rmv_elem = tommy_hashlin_remove(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash);
		if (rmv_elem && tommy_list_remove_existing(&spki_table->list, &rmv_elem->list_node)) {
			lrtr_free(rmv_elem);
			spki_table_notify_clients(spki_table, spki_record, false);
			rtval = SPKI_SUCCESS;
		}
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return rtval;
}